

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O0

void decompressBlockAlphaC(uint8 *data,uint8 *img,int width,int height,int ix,int iy,int channels)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int in_EDX;
  long in_RSI;
  byte *in_RDI;
  int in_R8D;
  int in_R9D;
  int bitpos;
  int index;
  int y;
  int x;
  int byte;
  int bit;
  int table;
  int alpha;
  int local_40;
  uint local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  bVar1 = *in_RDI;
  bVar2 = in_RDI[1];
  local_2c = 0;
  local_30 = 2;
  for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
      local_3c = 0;
      for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
        bVar3 = getbit(in_RDI[local_30],7 - local_2c,2 - local_40);
        local_3c = bVar3 | local_3c;
        local_2c = local_2c + 1;
        if (7 < local_2c) {
          local_2c = 0;
          local_30 = local_30 + 1;
        }
      }
      iVar4 = clamp((uint)bVar1 + alphaTable[(int)(uint)bVar2][(int)local_3c]);
      *(char *)(in_RSI + (in_R8D + local_34 + (in_R9D + local_38) * in_EDX) * bitpos) = (char)iVar4;
    }
  }
  return;
}

Assistant:

void decompressBlockAlphaC(uint8* data, uint8* img, int width, int height, int ix, int iy, int channels) 
{
	int alpha = data[0];
	int table = data[1];
	
	int bit=0;
	int byte=2;
	//extract an alpha value for each pixel.
	for(int x=0; x<4; x++) 
	{
		for(int y=0; y<4; y++) 
		{
			//Extract table index
			int index=0;
			for(int bitpos=0; bitpos<3; bitpos++) 
			{
				index|=getbit(data[byte],7-bit,2-bitpos);
				bit++;
				if(bit>7) 
				{
					bit=0;
					byte++;
				}
			}
			img[(ix+x+(iy+y)*width)*channels]=clamp(alpha +alphaTable[table][index]);
		}
	}
}